

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCofactor0New(uint *pOut,uint *pIn,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  uVar6 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar6 = 1;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      uVar5 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar5;
      }
      for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        pOut[uVar5] = (pIn[uVar5] & 0x55555555) * 3;
      }
      break;
    case 1:
      uVar5 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar5;
      }
      for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        pOut[uVar5] = (pIn[uVar5] & 0x33333333) * 5;
      }
      break;
    case 2:
      uVar5 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar5;
      }
      for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        pOut[uVar5] = (pIn[uVar5] & 0xf0f0f0f) * 0x11;
      }
      break;
    case 3:
      uVar5 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar5;
      }
      for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        pOut[uVar5] = (pIn[uVar5] & 0xff00ff) * 0x101;
      }
      break;
    case 4:
      uVar5 = 0;
      uVar9 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar9 = uVar5;
      }
      for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        pOut[uVar5] = (uint)(ushort)pIn[uVar5] * 0x10001;
      }
      break;
    default:
      bVar3 = (char)iVar - 5;
      bVar2 = bVar3 & 0x1f;
      uVar7 = 1 << bVar2;
      iVar4 = 2 << (bVar3 & 0x1f);
      iVar8 = 0 << bVar2;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      for (; iVar8 < (int)uVar6; iVar8 = iVar8 + iVar4) {
        for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
          uVar1 = pIn[uVar5];
          pOut[(long)(int)uVar7 + uVar5] = uVar1;
          pOut[uVar5] = uVar1;
        }
        pOut = pOut + iVar4;
        pIn = pIn + iVar4;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x20e,"void Kit_TruthCofactor0New(unsigned int *, unsigned int *, int, int)");
}

Assistant:

void Kit_TruthCofactor0New( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x55555555) | ((pIn[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x33333333) | ((pIn[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0F0F0F0F) | ((pIn[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x00FF00FF) | ((pIn[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0x0000FFFF) | ((pIn[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pOut[Step+i] = pIn[i];
            pIn += 2*Step;
            pOut += 2*Step;
        }
        return;
    }
}